

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.npatch.c
# Opt level: O0

void snga_set_patch_value
               (Integer type,Integer ndim,Integer *loA,Integer *hiA,Integer *ld,void *data_ptr,
               void *val)

{
  undefined8 uVar1;
  long *in_RCX;
  long *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  long in_R9;
  SingleComplex tmp_1;
  DoubleComplex tmp;
  Integer baseld [7];
  Integer bunit [7];
  Integer bvalue [7];
  Integer idx;
  Integer j;
  Integer i;
  Integer n1dim;
  undefined4 local_120;
  undefined4 uStack_11c;
  long local_108 [8];
  long local_c8 [8];
  long local_88 [7];
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long *local_28;
  long *local_20;
  long *local_18;
  long local_10;
  undefined8 local_8;
  
  local_38 = 1;
  for (local_40 = 1; local_40 < in_RSI; local_40 = local_40 + 1) {
    local_38 = ((in_RCX[local_40] - in_RDX[local_40]) + 1) * local_38;
  }
  local_88[0] = 0;
  local_88[1] = 0;
  local_c8[0] = 1;
  local_c8[1] = 1;
  local_108[0] = *in_R8;
  local_108[1] = *in_R8 * in_R8[1];
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_40 = 2; local_40 < local_10; local_40 = local_40 + 1) {
    local_88[local_40] = 0;
    local_c8[local_40] =
         local_c8[local_40 + -1] * ((local_20[local_40 + -1] - local_18[local_40 + -1]) + 1);
    local_108[local_40] = local_108[local_40 + -1] * local_28[local_40];
  }
  switch(local_8) {
  case 0x3e9:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        *(undefined4 *)(local_30 + (local_50 + local_48) * 4) = *(undefined4 *)tmp_1;
      }
    }
    break;
  case 0x3ea:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        *(undefined8 *)(local_30 + (local_50 + local_48) * 8) = *(undefined8 *)tmp_1;
      }
    }
    break;
  case 0x3eb:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        *(undefined4 *)(local_30 + (local_50 + local_48) * 4) = *(undefined4 *)tmp_1;
      }
    }
    break;
  case 0x3ec:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        *(undefined8 *)(local_30 + (local_50 + local_48) * 8) = *(undefined8 *)tmp_1;
      }
    }
    break;
  default:
    pnga_error((char *)bunit[4],bunit[3]);
    break;
  case 0x3ee:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        uVar1 = *(undefined8 *)tmp_1;
        local_120 = (undefined4)uVar1;
        *(undefined4 *)(local_30 + (local_50 + local_48) * 8) = local_120;
        uStack_11c = (undefined4)((ulong)uVar1 >> 0x20);
        *(undefined4 *)(local_30 + 4 + (local_50 + local_48) * 8) = uStack_11c;
      }
    }
    break;
  case 0x3ef:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        uVar1 = *(undefined8 *)((long)tmp_1 + 8);
        *(undefined8 *)(local_30 + (local_50 + local_48) * 0x10) = *(undefined8 *)tmp_1;
        *(undefined8 *)(local_30 + (local_50 + local_48) * 0x10 + 8) = uVar1;
      }
    }
    break;
  case 0x3f8:
    for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
      local_50 = 0;
      for (local_48 = 1; local_48 < local_10; local_48 = local_48 + 1) {
        local_50 = local_88[local_48] * local_108[local_48 + -1] + local_50;
        if ((local_40 + 1) % local_c8[local_48] == 0) {
          local_88[local_48] = local_88[local_48] + 1;
        }
        if (local_20[local_48] - local_18[local_48] < local_88[local_48]) {
          local_88[local_48] = 0;
        }
      }
      for (local_48 = 0; local_48 < (*local_20 - *local_18) + 1; local_48 = local_48 + 1) {
        *(undefined8 *)(local_30 + (local_50 + local_48) * 8) = *(undefined8 *)tmp_1;
      }
    }
  }
  return;
}

Assistant:

static void snga_set_patch_value(
        Integer type, Integer ndim, Integer *loA, Integer *hiA,
        Integer *ld, void *data_ptr, void *val)
{
  Integer n1dim, i, j, idx;
  Integer bvalue[MAXDIM], bunit[MAXDIM], baseld[MAXDIM];
  /* number of n-element of the first dimension */
  n1dim = 1; for(i=1; i<ndim; i++) n1dim *= (hiA[i] - loA[i] + 1);

  /* calculate the destination indices */
  bvalue[0] = 0; bvalue[1] = 0; bunit[0] = 1; bunit[1] = 1;
  /* baseld[0] = ld[0]
   * baseld[1] = ld[0] * ld[1]
   * baseld[2] = ld[0] * ld[1] * ld[2] .....
   */
  baseld[0] = ld[0]; baseld[1] = baseld[0] *ld[1];
  for(i=2; i<ndim; i++) {
    bvalue[i] = 0;
    bunit[i] = bunit[i-1] * (hiA[i-1] - loA[i-1] + 1);
    baseld[i] = baseld[i-1] * ld[i];
  }

  switch (type){
    case C_INT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }
        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          ((int *)data_ptr)[idx+j] = *(int*)val;
      }
      break;
    case C_DCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          DoubleComplex tmp = *(DoubleComplex *)val;
          ((DoubleComplex *)data_ptr)[idx+j].real = tmp.real;
          ((DoubleComplex *)data_ptr)[idx+j].imag = tmp.imag;
        }
      }
      break;
    case C_SCPL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) {
          SingleComplex tmp = *(SingleComplex *)val;
          ((SingleComplex *)data_ptr)[idx+j].real = tmp.real;
          ((SingleComplex *)data_ptr)[idx+j].imag = tmp.imag;
        }
      }
      break;
    case C_DBL:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }

        for(j=0; j<(hiA[0]-loA[0]+1); j++) 
          ((double*)data_ptr)[idx+j] =
            *(double*)val;
      }
      break;
    case C_FLOAT:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }
        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          ((float *)data_ptr)[idx+j] = *(float*)val;
      }
      break;     
    case C_LONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }
        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          ((long *)data_ptr)[idx+j] = *(long*)val;
      } 
      break;                          
    case C_LONGLONG:
      for(i=0; i<n1dim; i++) {
        idx = 0;
        for(j=1; j<ndim; j++) {
          idx += bvalue[j] * baseld[j-1];
          if(((i+1) % bunit[j]) == 0) bvalue[j]++;
          if(bvalue[j] > (hiA[j]-loA[j])) bvalue[j] = 0;
        }
        for(j=0; j<(hiA[0]-loA[0]+1); j++)
          ((long long*)data_ptr)[idx+j] = *(long long*)val;
      } 
      break;                          
    default: pnga_error(" wrong data type ",type);
  }

}